

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBlockMap.cpp
# Opt level: O2

void __thiscall
Memory::HeapBlockMap64::Cleanup(HeapBlockMap64 *this,bool concurrentFindImplicitRoot)

{
  HeapBlockMap64 HVar1;
  HeapAllocator *allocator;
  HeapBlockMap64 obj;
  
  obj.list = this->list;
  while (obj.list != (Node *)0x0) {
    HeapBlockMap32::Cleanup(&(obj.list)->map,false);
    HVar1.list = (obj.list)->next;
    if ((concurrentFindImplicitRoot) || (((obj.list)->map).count != 0)) {
      this = (HeapBlockMap64 *)&(obj.list)->next;
      obj.list = HVar1.list;
    }
    else {
      *this = (HeapBlockMap64)HVar1.list;
      allocator = HeapAllocator::GetNoMemProtectInstance();
      DeleteObject<Memory::HeapAllocator,(Memory::AllocatorDeleteFlags)0,Memory::HeapBlockMap64::Node>
                (allocator,obj.list);
      obj.list = HVar1.list;
    }
  }
  return;
}

Assistant:

void
HeapBlockMap64::Cleanup(bool concurrentFindImplicitRoot)
{
    Node ** prevnext = &this->list;
    Node * node = *prevnext;
    while (node != nullptr)
    {
        node->map.Cleanup(concurrentFindImplicitRoot);
        Node * nextNode = node->next;
        if (!concurrentFindImplicitRoot && node->map.Empty())
        {
            // Concurrent traversals of the node list would result in a race and possible UAF.
            // Currently we simply defer node free for the lifetime of the heap (only affects MemProtect).
            *prevnext = node->next;
            NoMemProtectHeapDelete(node);
        }
        else
        {
            prevnext = &node->next;
        }
        node = nextNode;
    }
}